

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

int GetLatestDataFromThreadRazorAHRSx(RAZORAHRS *pRazorAHRS,RAZORAHRSDATA *pRazorAHRSData)

{
  int iVar1;
  int local_24;
  int res;
  int id;
  RAZORAHRSDATA *pRazorAHRSData_local;
  RAZORAHRS *pRazorAHRS_local;
  
  local_24 = 0;
  do {
    if ((RAZORAHRS *)addrsRazorAHRS[local_24] == pRazorAHRS) {
      EnterCriticalSection(RazorAHRSCS + local_24);
      memcpy(pRazorAHRSData,razorahrsdataRazorAHRS + local_24,0x60);
      iVar1 = resRazorAHRS[local_24];
      LeaveCriticalSection(RazorAHRSCS + local_24);
      return iVar1;
    }
    local_24 = local_24 + 1;
  } while (local_24 < 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int GetLatestDataFromThreadRazorAHRSx(RAZORAHRS* pRazorAHRS, RAZORAHRSDATA* pRazorAHRSData)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsRazorAHRS[id] != pRazorAHRS)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	EnterCriticalSection(&RazorAHRSCS[id]);
	*pRazorAHRSData = razorahrsdataRazorAHRS[id];
	res = resRazorAHRS[id];
	LeaveCriticalSection(&RazorAHRSCS[id]);

	return res;
}